

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O2

int slu_mmdnum_(int *neqns,int *perm,int *invp,shortint *qsize)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)*neqns;
  if (*neqns < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    iVar5 = -invp[uVar3];
    if (qsize[uVar3] < 1) {
      iVar5 = invp[uVar3];
    }
    perm[uVar3] = iVar5;
  }
  iVar5 = 0;
  if (0 < *neqns) {
    iVar5 = *neqns;
  }
  for (uVar2 = 1; uVar2 != iVar5 + 1; uVar2 = uVar2 + 1) {
    if (perm[uVar2 - 1] < 1) {
      uVar3 = uVar2 & 0xffffffff;
      do {
        iVar6 = (int)uVar3;
        uVar1 = perm[(long)iVar6 + -1];
        uVar3 = (ulong)-uVar1;
      } while ((int)uVar1 < 1);
      invp[uVar2 - 1] = ~uVar1;
      perm[(long)iVar6 + -1] = uVar1 + 1;
      uVar3 = uVar2 & 0xffffffff;
      while( true ) {
        iVar4 = (int)uVar3;
        if (-1 < perm[(long)iVar4 + -1]) break;
        uVar3 = (ulong)(uint)-perm[(long)iVar4 + -1];
        perm[(long)iVar4 + -1] = -iVar6;
      }
    }
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)*neqns;
  if (*neqns < 1) {
    uVar2 = uVar3;
  }
  while (uVar2 != uVar3) {
    iVar5 = invp[uVar3];
    invp[uVar3] = -iVar5;
    uVar3 = uVar3 + 1;
    perm[-1 - (long)iVar5] = (int)uVar3;
  }
  return 0;
}

Assistant:

int slu_mmdnum_(const int *neqns, int *perm, int *invp, shortint *qsize)
{
    /* System generated locals */

    int i__1;

    /* Local variables */
    int_t node, root, nextf, father, nqsize, num;


/* *************************************************************** */


/* *************************************************************** */

    /* Parameter adjustments */
    --qsize;
    --invp;
    --perm;

    /* Function Body */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	nqsize = qsize[node];
	if (nqsize <= 0) {
	    perm[node] = invp[node];
	}
	if (nqsize > 0) {
	    perm[node] = -invp[node];
	}
/* L100: */
    }
/*        ------------------------------------------------------ */
/*        FOR EACH NODE WHICH HAS BEEN MERGED, DO THE FOLLOWING. */
/*        ------------------------------------------------------ */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	if (perm[node] > 0) {
	    goto L500;
	}
/*                ----------------------------------------- */
/*                TRACE THE MERGED TREE UNTIL ONE WHICH HAS */
/*                NOT BEEN MERGED, CALL IT ROOT. */
/*                ----------------------------------------- */
	father = node;
L200:
	if (perm[father] > 0) {
	    goto L300;
	}
	father = -perm[father];
	goto L200;
L300:
/*                ----------------------- */
/*                NUMBER NODE AFTER ROOT. */
/*                ----------------------- */
	root = father;
	num = perm[root] + 1;
	invp[node] = -num;
	perm[root] = num;
/*                ------------------------ */
/*                SHORTEN THE MERGED TREE. */
/*                ------------------------ */
	father = node;
L400:
	nextf = -perm[father];
	if (nextf <= 0) {
	    goto L500;
	}
	perm[father] = -root;
	father = nextf;
	goto L400;
L500:
	;
    }
/*        ---------------------- */
/*        READY TO COMPUTE PERM. */
/*        ---------------------- */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
	num = -invp[node];
	invp[node] = num;
	perm[num] = node;
/* L600: */
    }
    return 0;

}